

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O2

void __thiscall
cmExportFileGenerator::PopulateIncludeDirectoriesInterface
          (cmExportFileGenerator *this,cmTargetExport *tei,PreprocessContext preprocessRule,
          ImportPropertyMap *properties,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *missingTargets)

{
  cmGeneratorTarget *this_00;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  this_01;
  size_type sVar1;
  bool bVar2;
  char *pcVar3;
  cmLocalGenerator *pcVar4;
  string *psVar5;
  ostream *poVar6;
  mapped_type *pmVar7;
  long lVar8;
  char *pcVar9;
  string *e_1;
  _Alloc_hider in_name;
  allocator<char> local_279;
  string prepro;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_> cge
  ;
  string local_230;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_210;
  string exportDirs;
  cmGeneratorExpression ge;
  undefined1 local_1d8 [16];
  string dirs;
  string includes;
  
  local_210 = missingTargets;
  if (preprocessRule != InstallInterface) {
    __assert_fail("preprocessRule == cmGeneratorExpression::InstallInterface",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmExportFileGenerator.cxx"
                  ,0x172,
                  "void cmExportFileGenerator::PopulateIncludeDirectoriesInterface(cmTargetExport *, cmGeneratorExpression::PreprocessContext, ImportPropertyMap &, std::vector<std::string> &)"
                 );
  }
  this_00 = tei->Target;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&includes,"INTERFACE_INCLUDE_DIRECTORIES",(allocator<char> *)&dirs);
  pcVar3 = cmGeneratorTarget::GetProperty(this_00,&includes);
  std::__cxx11::string::~string((string *)&includes);
  local_1d8._0_8_ = (element_type *)0x0;
  local_1d8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  cmGeneratorExpression::cmGeneratorExpression(&ge,(cmListFileBacktrace *)local_1d8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1d8 + 8));
  cmGeneratorExpression::Preprocess(&dirs,&tei->InterfaceIncludeDirectories,InstallInterface,true);
  (*this->_vptr_cmExportFileGenerator[0x11])(this,&dirs);
  cmGeneratorExpression::Parse((cmGeneratorExpression *)&cge,(string *)&ge);
  this_01 = cge;
  pcVar4 = cmGeneratorTarget::GetLocalGenerator(this_00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&includes,"",(allocator<char> *)&local_230);
  prepro._M_dataplus._M_p = (pointer)&prepro.field_2;
  prepro._M_string_length = 0;
  prepro.field_2._M_local_buf[0] = '\0';
  psVar5 = cmCompiledGeneratorExpression::Evaluate
                     ((cmCompiledGeneratorExpression *)
                      this_01._M_t.
                      super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                      .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl,
                      pcVar4,&includes,false,this_00,(cmGeneratorTarget *)0x0,
                      (cmGeneratorExpressionDAGChecker *)0x0,&prepro);
  std::__cxx11::string::string((string *)&exportDirs,(string *)psVar5);
  std::__cxx11::string::~string((string *)&prepro);
  std::__cxx11::string::~string((string *)&includes);
  if (*(char *)((long)cge._M_t.
                      super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                      .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl +
               0x130) == '\x01') {
    pcVar4 = cmGeneratorTarget::GetLocalGenerator(this_00);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&includes);
    poVar6 = std::operator<<((ostream *)&includes,"Target \"");
    psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(this_00);
    poVar6 = std::operator<<(poVar6,(string *)psVar5);
    std::operator<<(poVar6,
                    "\" is installed with INCLUDES DESTINATION set to a context sensitive path.  Paths which depend on the configuration, policy values or the link interface are not supported.  Consider using target_include_directories instead."
                   );
    std::__cxx11::stringbuf::str();
    cmLocalGenerator::IssueMessage(pcVar4,FATAL_ERROR,&prepro);
    std::__cxx11::string::~string((string *)&prepro);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&includes);
    goto LAB_0021f850;
  }
  if (pcVar3 == (char *)0x0) {
    if (exportDirs._M_string_length == 0) goto LAB_0021f850;
LAB_0021f66a:
    includes._M_dataplus._M_p = (pointer)0x0;
    includes._M_string_length = 0;
    includes.field_2._M_allocated_capacity = 0;
    cmGeneratorExpression::Split
              (&exportDirs,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&includes);
    sVar1 = includes._M_string_length;
    exportDirs._M_string_length = 0;
    *exportDirs._M_dataplus._M_p = '\0';
    for (in_name = includes._M_dataplus; in_name._M_p != (pointer)sVar1;
        in_name._M_p = in_name._M_p + 0x20) {
      std::__cxx11::string::append((char *)&exportDirs);
      bVar2 = cmsys::SystemTools::FileIsFullPath((string *)in_name._M_p);
      if (!bVar2) {
        lVar8 = std::__cxx11::string::find(in_name._M_p,0x42c4e1);
        if (lVar8 == -1) {
          std::__cxx11::string::append((char *)&exportDirs);
        }
      }
      std::__cxx11::string::append((string *)&exportDirs);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&includes);
    pcVar9 = pcVar3;
    if (pcVar3 == (char *)0x0) {
      pcVar9 = "";
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&includes,pcVar9,(allocator<char> *)&prepro);
    pcVar9 = ";";
    if (pcVar3 == (char *)0x0) {
      pcVar9 = "";
    }
    std::operator+(&prepro,pcVar9,&exportDirs);
    std::__cxx11::string::append((string *)&includes);
    std::__cxx11::string::~string((string *)&prepro);
    cmGeneratorExpression::Preprocess(&prepro,&includes,InstallInterface,true);
    if (prepro._M_string_length != 0) {
      ResolveTargetsInGeneratorExpressions(this,&prepro,this_00,local_210,NoReplaceFreeTargets);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_230,"INTERFACE_INCLUDE_DIRECTORIES",&local_279);
      bVar2 = checkInterfaceDirs(&prepro,this_00,&local_230);
      std::__cxx11::string::~string((string *)&local_230);
      if (bVar2) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_230,"INTERFACE_INCLUDE_DIRECTORIES",&local_279);
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](properties,&local_230);
        std::__cxx11::string::_M_assign((string *)pmVar7);
        std::__cxx11::string::~string((string *)&local_230);
      }
    }
    std::__cxx11::string::~string((string *)&prepro);
  }
  else {
    if ((*pcVar3 != '\0') || (exportDirs._M_string_length != 0)) goto LAB_0021f66a;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&includes,"INTERFACE_INCLUDE_DIRECTORIES",(allocator<char> *)&prepro);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](properties,&includes);
    pmVar7->_M_string_length = 0;
    *(pmVar7->_M_dataplus)._M_p = '\0';
  }
  std::__cxx11::string::~string((string *)&includes);
LAB_0021f850:
  std::__cxx11::string::~string((string *)&exportDirs);
  std::
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
  ~unique_ptr(&cge);
  std::__cxx11::string::~string((string *)&dirs);
  cmGeneratorExpression::~cmGeneratorExpression(&ge);
  return;
}

Assistant:

void cmExportFileGenerator::PopulateIncludeDirectoriesInterface(
  cmTargetExport* tei, cmGeneratorExpression::PreprocessContext preprocessRule,
  ImportPropertyMap& properties, std::vector<std::string>& missingTargets)
{
  cmGeneratorTarget* target = tei->Target;
  assert(preprocessRule == cmGeneratorExpression::InstallInterface);

  const char* propName = "INTERFACE_INCLUDE_DIRECTORIES";
  const char* input = target->GetProperty(propName);

  cmGeneratorExpression ge;

  std::string dirs = cmGeneratorExpression::Preprocess(
    tei->InterfaceIncludeDirectories, preprocessRule, true);
  this->ReplaceInstallPrefix(dirs);
  std::unique_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(dirs);
  std::string exportDirs =
    cge->Evaluate(target->GetLocalGenerator(), "", false, target);

  if (cge->GetHadContextSensitiveCondition()) {
    cmLocalGenerator* lg = target->GetLocalGenerator();
    std::ostringstream e;
    e << "Target \"" << target->GetName()
      << "\" is installed with "
         "INCLUDES DESTINATION set to a context sensitive path.  Paths which "
         "depend on the configuration, policy values or the link interface "
         "are "
         "not supported.  Consider using target_include_directories instead.";
    lg->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }

  if (!input && exportDirs.empty()) {
    return;
  }
  if ((input && !*input) && exportDirs.empty()) {
    // Set to empty
    properties[propName].clear();
    return;
  }

  prefixItems(exportDirs);

  std::string includes = (input ? input : "");
  const char* sep = input ? ";" : "";
  includes += sep + exportDirs;
  std::string prepro =
    cmGeneratorExpression::Preprocess(includes, preprocessRule, true);
  if (!prepro.empty()) {
    this->ResolveTargetsInGeneratorExpressions(prepro, target, missingTargets);

    if (!checkInterfaceDirs(prepro, target, propName)) {
      return;
    }
    properties[propName] = prepro;
  }
}